

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O1

btCollisionShape * __thiscall
btCollisionWorldImporter::createPlaneShape
          (btCollisionWorldImporter *this,btVector3 *planeNormal,btScalar planeConstant)

{
  int iVar1;
  int iVar2;
  btCollisionShape **ptr;
  btStaticPlaneShape *this_00;
  btCollisionShape **ppbVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  this_00 = (btStaticPlaneShape *)btAlignedAllocInternal(0x68,0x10);
  btStaticPlaneShape::btStaticPlaneShape(this_00,planeNormal,planeConstant);
  iVar1 = (this->m_allocatedCollisionShapes).m_size;
  iVar2 = (this->m_allocatedCollisionShapes).m_capacity;
  if (iVar1 == iVar2) {
    iVar6 = 1;
    if (iVar1 != 0) {
      iVar6 = iVar1 * 2;
    }
    if (iVar2 < iVar6) {
      if (iVar6 == 0) {
        ppbVar3 = (btCollisionShape **)0x0;
      }
      else {
        ppbVar3 = (btCollisionShape **)btAlignedAllocInternal((long)iVar6 << 3,0x10);
      }
      lVar4 = (long)(this->m_allocatedCollisionShapes).m_size;
      if (0 < lVar4) {
        lVar5 = 0;
        do {
          ppbVar3[lVar5] = (this->m_allocatedCollisionShapes).m_data[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar4 != lVar5);
      }
      ptr = (this->m_allocatedCollisionShapes).m_data;
      if (ptr != (btCollisionShape **)0x0) {
        if ((this->m_allocatedCollisionShapes).m_ownsMemory == true) {
          btAlignedFreeInternal(ptr);
        }
        (this->m_allocatedCollisionShapes).m_data = (btCollisionShape **)0x0;
      }
      (this->m_allocatedCollisionShapes).m_ownsMemory = true;
      (this->m_allocatedCollisionShapes).m_data = ppbVar3;
      (this->m_allocatedCollisionShapes).m_capacity = iVar6;
    }
  }
  iVar1 = (this->m_allocatedCollisionShapes).m_size;
  (this->m_allocatedCollisionShapes).m_data[iVar1] = (btCollisionShape *)this_00;
  (this->m_allocatedCollisionShapes).m_size = iVar1 + 1;
  return (btCollisionShape *)this_00;
}

Assistant:

btCollisionShape* btCollisionWorldImporter::createPlaneShape(const btVector3& planeNormal,btScalar planeConstant)
{
	btStaticPlaneShape* shape = new btStaticPlaneShape(planeNormal,planeConstant);
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}